

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser-test.c++
# Opt level: O1

void capnp::anon_unknown_0::expectSourceInfo
               (Reader sourceInfo,uint64_t expectedId,StringPtr expectedComment,
               initializer_list<const_kj::StringPtr> expectedMembers)

{
  ListElementCount LVar1;
  int iVar2;
  StringPtr *params_3;
  size_t sVar3;
  ulong uVar4;
  unsigned_long i;
  ulong uVar5;
  bool bVar6;
  Reader RVar7;
  Reader members;
  StringPtr expectedComment_local;
  DebugComparison<unsigned_int,_unsigned_long> _kjCondition_1;
  uint64_t expectedId_local;
  Fault f;
  CapTableReader *local_58;
  WirePointer *local_48;
  StructPointerCount local_3c;
  int local_38;
  
  uVar4 = expectedMembers._M_len;
  params_3 = expectedMembers._M_array;
  expectedComment_local.content.size_ = expectedComment.content.size_;
  expectedComment_local.content.ptr = expectedComment.content.ptr;
  if (sourceInfo._reader.dataSize < 0x40) {
    members.reader.segment = (SegmentReader *)0x0;
  }
  else {
    members.reader.segment = *sourceInfo._reader.data;
  }
  members.reader.capTable = (CapTableReader *)&expectedId_local;
  members.reader.ptr = " == ";
  members.reader.elementCount = 5;
  members.reader.step = 0;
  members.reader.structDataSize._0_1_ = members.reader.segment == (SegmentReader *)expectedId;
  expectedId_local = expectedId;
  if ((members.reader.segment != (SegmentReader *)expectedId) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[50],kj::_::DebugComparison<unsigned_long,unsigned_long&>&,capnp::schema::Node::SourceInfo::Reader&,unsigned_long&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,200,ERROR,
               "\"failed: expected \" \"sourceInfo.getId() == expectedId\", _kjCondition, sourceInfo, expectedId"
               ,(char (*) [50])"failed: expected sourceInfo.getId() == expectedId",
               (DebugComparison<unsigned_long,_unsigned_long_&> *)&members,&sourceInfo,
               (unsigned_long *)members.reader.capTable);
  }
  members.reader.capTable = sourceInfo._reader.capTable;
  members.reader.ptr = (byte *)sourceInfo._reader.pointers;
  members.reader.segment = sourceInfo._reader.segment;
  LVar1 = sourceInfo._reader.nestingLimit;
  if (sourceInfo._reader.pointerCount == 0) {
    members.reader.capTable = (CapTableReader *)0x0;
    members.reader.ptr = (byte *)(WirePointer *)0x0;
    members.reader.segment = (SegmentReader *)0x0;
    LVar1 = 0x7fffffff;
  }
  members.reader.elementCount = LVar1;
  bVar6 = false;
  RVar7 = capnp::_::PointerReader::getBlob<capnp::Text>((PointerReader *)&members,(void *)0x0,0);
  sVar3 = RVar7.super_StringPtr.content.size_;
  if (sVar3 == expectedComment_local.content.size_) {
    if (sVar3 == 0) {
      bVar6 = true;
    }
    else {
      iVar2 = bcmp(RVar7.super_StringPtr.content.ptr,expectedComment_local.content.ptr,sVar3);
      bVar6 = iVar2 == 0;
    }
  }
  members.reader.ptr = (byte *)&expectedComment_local;
  members.reader._24_8_ = anon_var_dwarf_3a16;
  members.reader.structDataSize = 5;
  members.reader.structPointerCount = 0;
  members.reader.elementSize = VOID;
  members.reader._39_1_ = 0;
  members.reader._0_16_ = RVar7;
  members.reader.nestingLimit._0_1_ = bVar6;
  if ((bVar6 == false) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::
    log<char_const(&)[63],kj::_::DebugComparison<capnp::Text::Reader,kj::StringPtr&>&,capnp::schema::Node::SourceInfo::Reader&,kj::StringPtr&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0xc9,ERROR,
               "\"failed: expected \" \"sourceInfo.getDocComment() == expectedComment\", _kjCondition, sourceInfo, expectedComment"
               ,(char (*) [63])"failed: expected sourceInfo.getDocComment() == expectedComment",
               (DebugComparison<capnp::Text::Reader,_kj::StringPtr_&> *)&members,&sourceInfo,
               (StringPtr *)members.reader.ptr);
  }
  if (sourceInfo._reader.pointerCount < 2) {
    iVar2 = 0x7fffffff;
    _kjCondition_1.right = 0;
    _kjCondition_1.op.content.ptr = (char *)0x0;
    _kjCondition_1._0_8_ = (SegmentReader *)0x0;
  }
  else {
    _kjCondition_1.op.content.ptr = (char *)(sourceInfo._reader.pointers + 1);
    _kjCondition_1.right = (unsigned_long)sourceInfo._reader.capTable;
    _kjCondition_1._0_8_ = sourceInfo._reader.segment;
    iVar2 = sourceInfo._reader.nestingLimit;
  }
  _kjCondition_1.op.content.size_ = CONCAT44(_kjCondition_1.op.content.size_._4_4_,iVar2);
  capnp::_::PointerReader::getList
            (&members.reader,(PointerReader *)&_kjCondition_1,INLINE_COMPOSITE,(word *)0x0);
  _kjCondition_1.left = members.reader.elementCount;
  _kjCondition_1.right = uVar4;
  _kjCondition_1.op.content.ptr = " == ";
  _kjCondition_1.op.content.size_ = 5;
  bVar6 = (members.reader._24_8_ & 0xffffffff) == uVar4;
  _kjCondition_1.result = bVar6;
  if (!bVar6) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long>&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-parser-test.c++"
               ,0xcc,FAILED,"members.size() == expectedMembers.size()","_kjCondition,",
               &_kjCondition_1);
    kj::_::Debug::Fault::fatal(&f);
  }
  if (uVar4 != 0) {
    uVar5 = 0;
    do {
      capnp::_::ListReader::getStructElement((StructReader *)&f,&members.reader,(ElementCount)uVar5)
      ;
      _kjCondition_1.right = (unsigned_long)local_58;
      _kjCondition_1.op.content.ptr = (char *)local_48;
      _kjCondition_1._0_8_ = f;
      iVar2 = local_38;
      if (local_3c == 0) {
        _kjCondition_1.right = (unsigned_long)(CapTableReader *)0x0;
        _kjCondition_1.op.content.ptr = (char *)(WirePointer *)0x0;
        _kjCondition_1._0_8_ = (Exception *)0x0;
        iVar2 = 0x7fffffff;
      }
      _kjCondition_1.op.content.size_ = CONCAT44(_kjCondition_1.op.content.size_._4_4_,iVar2);
      bVar6 = false;
      RVar7 = capnp::_::PointerReader::getBlob<capnp::Text>
                        ((PointerReader *)&_kjCondition_1,(void *)0x0,0);
      sVar3 = RVar7.super_StringPtr.content.size_;
      if (sVar3 == (params_3->content).size_) {
        if (sVar3 == 0) {
          bVar6 = true;
        }
        else {
          iVar2 = bcmp(RVar7.super_StringPtr.content.ptr,(params_3->content).ptr,sVar3);
          bVar6 = iVar2 == 0;
        }
      }
      _kjCondition_1.op.content.size_ = (size_t)anon_var_dwarf_3a16;
      _kjCondition_1.result = true;
      _kjCondition_1._33_7_ = 0;
      _kjCondition_1._0_16_ = RVar7;
      _kjCondition_1.op.content.ptr = (char *)params_3;
      if ((!bVar6) && (kj::_::Debug::minSeverity < 3)) {
        capnp::_::ListReader::getStructElement
                  ((StructReader *)&f,&members.reader,(ElementCount)uVar5);
        kj::_::Debug::
        log<char_const(&)[74],kj::_::DebugComparison<capnp::Text::Reader,kj::StringPtr_const&>&,capnp::schema::Node::SourceInfo::Member::Reader,kj::StringPtr_const&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-parser-test.c++"
                   ,0xcf,ERROR,
                   "\"failed: expected \" \"members[i].getDocComment() == expectedMembers.begin()[i]\", _kjCondition, members[i], expectedMembers.begin()[i]"
                   ,(char (*) [74])
                    "failed: expected members[i].getDocComment() == expectedMembers.begin()[i]",
                   (DebugComparison<capnp::Text::Reader,_const_kj::StringPtr_&> *)&_kjCondition_1,
                   (Reader *)&f,params_3);
      }
      uVar5 = uVar5 + 1;
      params_3 = params_3 + 1;
    } while (uVar4 != uVar5);
  }
  return;
}

Assistant:

void expectSourceInfo(schema::Node::SourceInfo::Reader sourceInfo,
                   uint64_t expectedId, kj::StringPtr expectedComment,
                   std::initializer_list<const kj::StringPtr> expectedMembers) {
  KJ_EXPECT(sourceInfo.getId() == expectedId, sourceInfo, expectedId);
  KJ_EXPECT(sourceInfo.getDocComment() == expectedComment, sourceInfo, expectedComment);

  auto members = sourceInfo.getMembers();
  KJ_ASSERT(members.size() == expectedMembers.size());
  for (auto i: kj::indices(expectedMembers)) {
    KJ_EXPECT(members[i].getDocComment() == expectedMembers.begin()[i],
              members[i], expectedMembers.begin()[i]);
  }
}